

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

void __thiscall
Js::CatchScopeWalker::FetchValueAndAddress
          (CatchScopeWalker *this,DebuggerScopeProperty *scopeProperty,Var *pValue,
          IDiagObjectAddress **ppAddress)

{
  DiagStackFrame *pDVar1;
  JavascriptLibrary *pJVar2;
  JavascriptString *pJVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  RegSlot RVar8;
  undefined4 *puVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Var aValue;
  RecyclableObject *originalInstance;
  RecyclableObject *instance;
  JavascriptString *pJVar10;
  JavascriptString *_value;
  RecyclableObjectAddress *this_00;
  undefined4 extraout_var_02;
  ScriptContext *scriptContext;
  undefined4 extraout_var_01;
  
  if (pValue == (Var *)0x0 && ppAddress == (IDiagObjectAddress **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x6d3,"(pValue != nullptr || ppAddress != nullptr)",
                                "pValue != nullptr || ppAddress != nullptr");
    if (!bVar5) goto LAB_008c15fc;
    *puVar9 = 0;
  }
  iVar6 = (*this->pFrame->_vptr_DiagStackFrame[0xe])();
  iVar7 = (*this->pFrame->_vptr_DiagStackFrame[10])();
  scriptContext = (ScriptContext *)CONCAT44(extraout_var_00,iVar7);
  pDVar1 = this->pFrame;
  if (this->debuggerScope->scopeType == DiagCatchScopeInObject) {
    RVar8 = DebuggerScope::GetLocation(this->debuggerScope);
    iVar7 = (*pDVar1->_vptr_DiagStackFrame[0x12])(pDVar1,(ulong)RVar8);
    aValue = (Var)CONCAT44(extraout_var_01,iVar7);
    bVar5 = VarIs<Js::RecyclableObject>(aValue);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0x6dd,"(VarIs<RecyclableObject>(obj))",
                                  "VarIs<RecyclableObject>(obj)");
      if (!bVar5) {
LAB_008c15fc:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar9 = 0;
    }
    originalInstance = VarTo<Js::RecyclableObject>(aValue);
    instance = VarTo<Js::RecyclableObject>(aValue);
    pJVar10 = (JavascriptString *)
              RecyclableObjectWalker::GetObject
                        (originalInstance,instance,scopeProperty->propId,scriptContext);
    pJVar2 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    pJVar3 = (JavascriptString *)(pJVar2->undeclBlockVarSentinel).ptr;
    _value = pJVar10;
    if (pJVar3 == pJVar10) {
      _value = JavascriptLibrary::GetDebuggerDeadZoneBlockVariableString(pJVar2);
    }
    this_00 = (RecyclableObjectAddress *)
              new<Memory::ArenaAllocator>
                        (0x28,(ArenaAllocator *)CONCAT44(extraout_var,iVar6),0x366bee);
    RecyclableObjectAddress::RecyclableObjectAddress
              (this_00,aValue,scopeProperty->propId,_value,(uint)(pJVar3 == pJVar10));
  }
  else {
    iVar7 = (*pDVar1->_vptr_DiagStackFrame[5])(pDVar1,(ulong)scopeProperty->location,0);
    _value = (JavascriptString *)CONCAT44(extraout_var_02,iVar7);
    pJVar2 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    if ((JavascriptString *)(pJVar2->undeclBlockVarSentinel).ptr == _value) {
      _value = JavascriptLibrary::GetDebuggerDeadZoneBlockVariableString(pJVar2);
    }
    this_00 = (RecyclableObjectAddress *)
              new<Memory::ArenaAllocator>
                        (0x20,(ArenaAllocator *)CONCAT44(extraout_var,iVar6),0x366bee);
    LocalObjectAddressForRegSlot::LocalObjectAddressForRegSlot
              ((LocalObjectAddressForRegSlot *)this_00,this->pFrame,scopeProperty->location,_value);
  }
  if (pValue != (Var *)0x0) {
    *pValue = _value;
  }
  if (ppAddress != (IDiagObjectAddress **)0x0) {
    *ppAddress = &this_00->super_IDiagObjectAddress;
  }
  return;
}

Assistant:

void CatchScopeWalker::FetchValueAndAddress(DebuggerScopeProperty &scopeProperty, _Out_opt_ Var *pValue, _Out_opt_ IDiagObjectAddress ** ppAddress)
    {
        Assert(pValue != nullptr || ppAddress != nullptr);

        ArenaAllocator* arena = pFrame->GetArena();
        Var outValue;
        IDiagObjectAddress * pAddress = nullptr;

        ScriptContext* scriptContext = pFrame->GetScriptContext();
        if (debuggerScope->scopeType == Js::DiagCatchScopeInObject)
        {
            Var obj = pFrame->GetInnerScopeFromRegSlot(debuggerScope->GetLocation());
            Assert(VarIs<RecyclableObject>(obj));

            outValue = RecyclableObjectWalker::GetObject(VarTo<RecyclableObject>(obj), VarTo<RecyclableObject>(obj), scopeProperty.propId, scriptContext);
            bool isInDeadZone = scriptContext->IsUndeclBlockVar(outValue);
            if (isInDeadZone)
            {
                outValue = scriptContext->GetLibrary()->GetDebuggerDeadZoneBlockVariableString();

            }
            pAddress = Anew(arena, RecyclableObjectAddress, obj, scopeProperty.propId, outValue, isInDeadZone);
        }
        else
        {
            outValue = pFrame->GetRegValue(scopeProperty.location);
            bool isInDeadZone = scriptContext->IsUndeclBlockVar(outValue);
            if (isInDeadZone)
            {
                outValue = scriptContext->GetLibrary()->GetDebuggerDeadZoneBlockVariableString();

            }
            pAddress = Anew(arena, LocalObjectAddressForRegSlot, pFrame, scopeProperty.location, outValue);
        }

        if (pValue)
        {
            *pValue = outValue;
        }

        if (ppAddress)
        {
            *ppAddress = pAddress;
        }
    }